

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::CaseExpression::Copy(CaseExpression *this)

{
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> uVar3;
  pointer pCVar4;
  pointer pPVar5;
  ParsedExpression *in_RSI;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  CaseCheck new_check;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_60;
  CaseCheck local_58;
  _Head_base<0UL,_duckdb::CaseExpression_*,_false> local_40;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_38
  ;
  
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)this;
  make_uniq<duckdb::CaseExpression>();
  pCVar4 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::
           operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                       *)&local_40);
  ParsedExpression::CopyProperties(&pCVar4->super_ParsedExpression,in_RSI);
  puVar1 = *(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             **)&in_RSI[1].super_BaseExpression.type;
  for (this_00 = (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)in_RSI[1].super_BaseExpression._vptr_BaseExpression; this_00 != puVar1;
      this_00 = this_00 + 2) {
    local_58.when_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
          )0x0;
    local_58.then_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
          )0x0;
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(this_00);
    (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_60,pPVar5);
    uVar3.super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         local_58.when_expr;
    local_58.when_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         local_60._M_head_impl;
    local_60._M_head_impl = (ParsedExpression *)0x0;
    if (uVar3.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)uVar3.
                            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl +
                  8))();
      if (local_60._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(this_00 + 1);
    (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_60,pPVar5);
    uVar3.super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         local_58.then_expr;
    local_58.then_expr.
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         local_60._M_head_impl;
    local_60._M_head_impl = (ParsedExpression *)0x0;
    if (uVar3.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)uVar3.
                            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl +
                  8))();
      if (local_60._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
    pCVar4 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::
             operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                         *)&local_40);
    ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::
    emplace_back<duckdb::CaseCheck>
              (&(pCVar4->case_checks).
                super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>,&local_58);
    CaseCheck::~CaseCheck(&local_58);
  }
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)&in_RSI[1].super_BaseExpression.alias._M_string_length);
  (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_58,pPVar5);
  pCVar4 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>::
           operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                       *)&local_40);
  uVar3.super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       local_58.when_expr.
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  local_58.when_expr.
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
       (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
        )0x0;
  _Var2._M_head_impl =
       (pCVar4->else_expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pCVar4->else_expr).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (ParsedExpression *)
       uVar3.
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
    if (local_58.when_expr.
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_58.when_expr.
                            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl +
                  8))();
    }
  }
  *(CaseExpression **)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = local_40._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )local_38._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> CaseExpression::Copy() const {
	auto copy = make_uniq<CaseExpression>();
	copy->CopyProperties(*this);
	for (auto &check : case_checks) {
		CaseCheck new_check;
		new_check.when_expr = check.when_expr->Copy();
		new_check.then_expr = check.then_expr->Copy();
		copy->case_checks.push_back(std::move(new_check));
	}
	copy->else_expr = else_expr->Copy();
	return std::move(copy);
}